

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O0

void __thiscall EventLoop::unregisterSocket(EventLoop *this,int fd)

{
  uint uVar1;
  FILE *__stream;
  uint uVar2;
  bool bVar3;
  int *piVar4;
  uint *puVar5;
  char *pcVar6;
  String local_88;
  undefined1 local_68 [8];
  epoll_event ev;
  int e;
  _Self local_40 [3];
  _Self local_28;
  iterator socket;
  lock_guard<std::mutex> locker;
  int fd_local;
  EventLoop *this_local;
  
  locker._M_device._4_4_ = fd;
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&socket,&this->mMutex);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<int,_std::pair<unsigned_int,_std::function<void_(int,_unsigned_int)>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<unsigned_int,_std::function<void_(int,_unsigned_int)>_>_>_>_>
       ::find(&this->mSockets,(key_type_conflict *)((long)&locker._M_device + 4));
  local_40[0]._M_node =
       (_Base_ptr)
       std::
       map<int,_std::pair<unsigned_int,_std::function<void_(int,_unsigned_int)>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<unsigned_int,_std::function<void_(int,_unsigned_int)>_>_>_>_>
       ::end(&this->mSockets);
  bVar3 = std::operator==(&local_28,local_40);
  if (!bVar3) {
    register0x00000000 =
         std::
         map<int,std::pair<unsigned_int,std::function<void(int,unsigned_int)>>,std::less<int>,std::allocator<std::pair<int_const,std::pair<unsigned_int,std::function<void(int,unsigned_int)>>>>>
         ::erase_abi_cxx11_((map<int,std::pair<unsigned_int,std::function<void(int,unsigned_int)>>,std::less<int>,std::allocator<std::pair<int_const,std::pair<unsigned_int,std::function<void(int,unsigned_int)>>>>>
                             *)&this->mSockets,local_28._M_node);
    memset(local_68,0,0xc);
    ev.data.fd = epoll_ctl(this->mPollFd,2,locker._M_device._4_4_,(epoll_event *)local_68);
    if ((ev.data.fd == -1) &&
       (piVar4 = __errno_location(), uVar2 = locker._M_device._4_4_, __stream = _stderr,
       *piVar4 != 2)) {
      puVar5 = (uint *)__errno_location();
      uVar1 = *puVar5;
      piVar4 = __errno_location();
      Rct::strerror((Rct *)&local_88,*piVar4);
      pcVar6 = String::constData(&local_88);
      fprintf(__stream,"Unable to unregister socket %d: %d (%s)\n",(ulong)uVar2,(ulong)uVar1,pcVar6)
      ;
      String::~String(&local_88);
    }
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&socket);
  return;
}

Assistant:

void EventLoop::unregisterSocket(int fd)
{
    std::lock_guard<std::mutex> locker(mMutex);
    auto socket = mSockets.find(fd);
    if (socket == mSockets.end())
        return;
#ifdef HAVE_KQUEUE
    const int mode = socket->second.first;
#endif
    mSockets.erase(socket);

    int e;
#if defined(HAVE_EPOLL)
    epoll_event ev;
    memset(&ev, 0, sizeof(ev));
    e = epoll_ctl(mPollFd, EPOLL_CTL_DEL, fd, &ev);
#elif defined(HAVE_KQUEUE)
    e = 0;
    const struct { int rf; int kf; } flags[] = {
        { SocketRead, EVFILT_READ },
        { SocketWrite, EVFILT_WRITE },
        { 0, 0 }
    };
    for (int i = 0; flags[i].rf; ++i) {
        if (!(mode & flags[i].rf))
            continue;
        struct kevent ev;
        memset(&ev, '\0', sizeof(struct kevent));
        ev.ident = fd;
        ev.flags = EV_DELETE|EV_DISABLE;
        ev.filter = flags[i].kf;
        eintrwrap(e, kevent(mPollFd, &ev, 1, 0, 0, 0));
    }
#elif defined(HAVE_SELECT)
    e = 0; // fake ok
    wakeup();
#endif
    if (e == -1) {
        if (errno != ENOENT) {
            fprintf(stderr, "Unable to unregister socket %d: %d (%s)\n",
                    fd, errno, Rct::strerror().constData());
        }
    }
}